

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall
S2Builder::AddSnappedEdges
          (S2Builder *this,InputEdgeId begin,InputEdgeId end,GraphOptions *options,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_edge_ids,IdSetLexicon *input_edge_id_set_lexicon,
          vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
          *site_vertices)

{
  pointer *pppVar1;
  compact_array_base<int,_std::allocator<int>_> *pcVar2;
  int iVar3;
  EdgeType EVar4;
  int iVar5;
  pointer pcVar6;
  iterator iVar7;
  iterator iVar8;
  pointer ppVar9;
  VType VVar10;
  pair<int,_int> pVar11;
  pair<int,_int> pVar12;
  pair<int,_int> pVar13;
  pair<int,_int> pVar14;
  uint uVar15;
  iterator pvVar16;
  ostream *poVar17;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar18;
  Vector3<double> *__args;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *points;
  ulong uVar19;
  InputEdgeId e;
  pointer ppVar20;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> v;
  vector<int,_std::allocator<int>_> chain;
  ulong local_b0;
  string local_a8;
  S2Builder *local_88;
  int local_7c;
  void *local_78;
  iterator iStack_70;
  Vector3<double> *local_68;
  vector<int,_std::allocator<int>_> local_58;
  DegenerateEdges local_40;
  InputEdgeId local_3c;
  GraphOptions *local_38;
  
  local_40 = options->degenerate_edges_;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88 = this;
  local_7c = begin;
  local_3c = end;
  local_38 = options;
  if (begin < end) {
    local_b0 = (ulong)(uint)begin;
    do {
      if (local_7c < 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/id_set_lexicon.h"
                   ,0xad,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_a8._M_string_length,"Check failed: (id) >= (0) ",0x1a);
        abort();
      }
      e = (InputEdgeId)local_b0;
      SnapEdge(local_88,e,&local_58);
      pcVar6 = (site_vertices->
               super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pcVar6 != (site_vertices->
                    super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        iVar3 = (local_88->input_edges_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[local_b0].first;
        pcVar2 = &pcVar6[*local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start].
                  super_compact_array_base<int,_std::allocator<int>_>;
        uVar15 = *(uint *)&pcVar6[*local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start].
                           super_compact_array_base<int,_std::allocator<int>_> & 0xffffff;
        if (uVar15 != 0) {
          if (pcVar2->is_inlined_ == false) {
            paVar18 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13
                       *)(pcVar2->field_7).pointer_;
          }
          else {
            paVar18 = &pcVar2->field_7;
          }
          if (*(int *)((long)paVar18 + (ulong)uVar15 * 4 + -4) == iVar3) goto LAB_001ae8e5;
        }
        if (pcVar2->is_inlined_ == false) {
          paVar18 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
                    (pcVar2->field_7).pointer_;
        }
        else {
          paVar18 = &pcVar2->field_7;
        }
        pvVar16 = gtl::compact_array_base<int,_std::allocator<int>_>::make_hole
                            (pcVar2,(const_iterator)((long)paVar18 + (ulong)uVar15 * 4),1);
        *pvVar16 = iVar3;
      }
LAB_001ae8e5:
      if ((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == 4) {
        if (local_40 != DISCARD) {
          iVar3 = *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          EVar4 = local_38->edge_type_;
          local_78 = (void *)CONCAT44(local_78._4_4_,e);
          iVar7._M_current =
               (edges->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          local_a8._M_dataplus._M_p._0_4_ = iVar3;
          local_a8._M_dataplus._M_p._4_4_ = iVar3;
          if (iVar7._M_current ==
              (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,iVar7,
                       (pair<int,_int> *)&local_a8);
          }
          else {
            pVar11.second = iVar3;
            pVar11.first = iVar3;
            *iVar7._M_current = pVar11;
            pppVar1 = &(edges->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          iVar8._M_current =
               (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current ==
              (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)input_edge_ids,iVar8,(int *)&local_78);
          }
          else {
            *iVar8._M_current = (int)local_78;
            (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
          if (EVar4 == UNDIRECTED) {
            iVar7._M_current =
                 (edges->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_a8._M_dataplus._M_p._0_4_ = iVar3;
              local_a8._M_dataplus._M_p._4_4_ = iVar3;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,
                         iVar7,(pair<int,_int> *)&local_a8);
            }
            else {
              pVar12.second = iVar3;
              pVar12.first = iVar3;
              *iVar7._M_current = pVar12;
              pppVar1 = &(edges->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
              local_a8._M_dataplus._M_p._4_4_ = iVar3;
            }
            local_a8._M_dataplus._M_p._0_4_ = -0x80000000;
            iVar8._M_current =
                 (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (input_edge_ids,iVar8,(int *)&local_a8);
            }
            else {
              *iVar8._M_current = -0x80000000;
              (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
          }
        }
      }
      else {
        pcVar6 = (site_vertices->
                 super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pcVar6 != (site_vertices->
                      super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          iVar3 = (local_88->input_edges_).
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[local_b0].second;
          pcVar2 = &pcVar6[local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish[-1]].
                    super_compact_array_base<int,_std::allocator<int>_>;
          uVar15 = *(uint *)&pcVar6[local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish[-1]].
                             super_compact_array_base<int,_std::allocator<int>_> & 0xffffff;
          if (uVar15 != 0) {
            if (pcVar2->is_inlined_ == false) {
              paVar18 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13
                         *)(pcVar2->field_7).pointer_;
            }
            else {
              paVar18 = &pcVar2->field_7;
            }
            if (*(int *)((long)paVar18 + (ulong)uVar15 * 4 + -4) == iVar3) goto LAB_001aea1b;
          }
          if (pcVar2->is_inlined_ == false) {
            paVar18 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13
                       *)(pcVar2->field_7).pointer_;
          }
          else {
            paVar18 = &pcVar2->field_7;
          }
          pvVar16 = gtl::compact_array_base<int,_std::allocator<int>_>::make_hole
                              (pcVar2,(const_iterator)((long)paVar18 + (ulong)uVar15 * 4),1);
          *pvVar16 = iVar3;
        }
LAB_001aea1b:
        if (4 < (ulong)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start)) {
          uVar19 = 1;
          do {
            iVar3 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar19 - 1];
            iVar5 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar19];
            EVar4 = local_38->edge_type_;
            local_78 = (void *)CONCAT44(local_78._4_4_,e);
            iVar7._M_current =
                 (edges->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            local_a8._M_dataplus._M_p._0_4_ = iVar3;
            local_a8._M_dataplus._M_p._4_4_ = iVar5;
            if (iVar7._M_current ==
                (edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,
                         iVar7,(pair<int,_int> *)&local_a8);
            }
            else {
              pVar13.second = iVar5;
              pVar13.first = iVar3;
              *iVar7._M_current = pVar13;
              pppVar1 = &(edges->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
            iVar8._M_current =
                 (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)input_edge_ids,iVar8,(int *)&local_78);
            }
            else {
              *iVar8._M_current = (int)local_78;
              (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
            if (EVar4 == UNDIRECTED) {
              iVar7._M_current =
                   (edges->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              local_a8._M_dataplus._M_p._4_4_ = iVar3;
              if (iVar7._M_current ==
                  (edges->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_a8._M_dataplus._M_p._0_4_ = iVar5;
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,
                           iVar7,(pair<int,_int> *)&local_a8);
              }
              else {
                pVar14.second = iVar3;
                pVar14.first = iVar5;
                *iVar7._M_current = pVar14;
                pppVar1 = &(edges->
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *pppVar1 = *pppVar1 + 1;
              }
              local_a8._M_dataplus._M_p._0_4_ = -0x80000000;
              iVar8._M_current =
                   (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (input_edge_ids,iVar8,(int *)&local_a8);
              }
              else {
                *iVar8._M_current = -0x80000000;
                (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar8._M_current + 1;
              }
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 < (ulong)((long)local_58.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
      }
      local_b0 = local_b0 + 1;
    } while ((int)local_b0 < local_3c);
  }
  if (s2builder_verbose != false) {
    ppVar20 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar9 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar20 != ppVar9) {
      do {
        local_78 = (void *)0x0;
        iStack_70._M_current = (Vector3<double> *)0x0;
        local_68 = (Vector3<double> *)0x0;
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>
                  ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&local_78,
                   (iterator)0x0,
                   (local_88->sites_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_start + ppVar20->first);
        __args = (local_88->sites_).
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                 super__Vector_impl_data._M_start + ppVar20->second;
        if (iStack_70._M_current == local_68) {
          std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
          _M_realloc_insert<Vector3<double>const&>
                    ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&local_78,iStack_70,
                     __args);
        }
        else {
          (iStack_70._M_current)->c_[2] = __args->c_[2];
          VVar10 = __args->c_[1];
          (iStack_70._M_current)->c_[0] = __args->c_[0];
          (iStack_70._M_current)->c_[1] = VVar10;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S2Polyline: ",0xc)
        ;
        s2textformat::ToString_abi_cxx11_(&local_a8,(s2textformat *)&local_78,points);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             (char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                              (int)local_a8._M_dataplus._M_p),
                             local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"(",1);
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,ppVar20->first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,ppVar20->second);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p));
        }
        if (local_78 != (void *)0x0) {
          operator_delete(local_78);
        }
        ppVar20 = ppVar20 + 1;
      } while (ppVar20 != ppVar9);
    }
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void S2Builder::AddSnappedEdges(
    InputEdgeId begin, InputEdgeId end, const GraphOptions& options,
    vector<Edge>* edges, vector<InputEdgeIdSetId>* input_edge_ids,
    IdSetLexicon* input_edge_id_set_lexicon,
    vector<compact_array<InputVertexId>>* site_vertices) const {
  bool discard_degenerate_edges = (options.degenerate_edges() ==
                                   GraphOptions::DegenerateEdges::DISCARD);
  vector<SiteId> chain;
  for (InputEdgeId e = begin; e < end; ++e) {
    InputEdgeIdSetId id = input_edge_id_set_lexicon->AddSingleton(e);
    SnapEdge(e, &chain);
    MaybeAddInputVertex(input_edges_[e].first, chain[0], site_vertices);
    if (chain.size() == 1) {
      if (discard_degenerate_edges) continue;
      AddSnappedEdge(chain[0], chain[0], id, options.edge_type(),
                     edges, input_edge_ids);
    } else {
      MaybeAddInputVertex(input_edges_[e].second, chain.back(), site_vertices);
      for (int i = 1; i < chain.size(); ++i) {
        AddSnappedEdge(chain[i-1], chain[i], id, options.edge_type(),
                       edges, input_edge_ids);
      }
    }
  }
  if (s2builder_verbose) DumpEdges(*edges, sites_);
}